

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodes.c
# Opt level: O3

void bit_24(void)

{
  byte bVar1;
  
  bVar1 = getbyte(pc);
  temp1 = RAM[bVar1];
  result_f = (acc | 0x80) & temp1;
  ovr_f = temp1 & 0x40;
  if ((char)temp1 < '\0' && (acc & temp1) == 0) {
    except = '\x01';
  }
  pc = pc + 1;
  return;
}

Assistant:

void bit_24(void) {
    temp1 = RAM[getbyte(pc)];
    result_f = (acc & temp1);
    result_f |= (temp1 & 0x80);
    ovr_f = temp1 & 0x40;
    if ((!(acc & temp1)) && (temp1 & 0x80)) except = 1;
    pc++;
}